

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O2

exr_attr_chlist_entry_t * __thiscall
Imf_3_4::Context::findChannel(Context *this,int partidx,char *name)

{
  int iVar1;
  exr_attr_chlist_entry_t *peVar2;
  int iVar3;
  exr_attr_chlist_t *peVar4;
  size_t sVar5;
  int i;
  long lVar6;
  long lVar7;
  
  peVar4 = channels(this,partidx);
  sVar5 = strlen(name);
  iVar1 = peVar4->num_channels;
  lVar7 = 0;
  lVar6 = 0;
  while( true ) {
    if (iVar1 <= lVar6) {
      return (exr_attr_chlist_entry_t *)0x0;
    }
    peVar2 = peVar4->entries;
    if ((*(int *)(peVar2->reserved + lVar7 + -0x15) == (int)sVar5) &&
       (iVar3 = bcmp(name,*(void **)(peVar2->reserved + lVar7 + -0xd),(long)(int)sVar5), iVar3 == 0)
       ) break;
    lVar6 = lVar6 + 1;
    lVar7 = lVar7 + 0x20;
  }
  return (exr_attr_chlist_entry_t *)(peVar2->reserved + lVar7 + -0x15);
}

Assistant:

const exr_attr_chlist_entry_t* Context::findChannel (int partidx, const char* name) const
{
    const exr_attr_chlist_t* cl  = channels (partidx);
    int32_t                  len = strlen (name);

    for (int i = 0; i < cl->num_channels; ++i)
    {
        const exr_attr_chlist_entry_t* curc = cl->entries + i;
        if (curc->name.length == len && 0 == memcmp (name, curc->name.str, len))
        {
            return curc;
        }
    }
    return nullptr;
}